

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clump.cpp
# Opt level: O3

uint32 __thiscall rw::Clump::streamGetSize(Clump *this)

{
  LLLink *pLVar1;
  bool bVar2;
  uint32 uVar3;
  LLLink *pLVar4;
  int iVar5;
  int iVar6;
  
  bVar2 = 0x33000 < version;
  uVar3 = FrameList_::streamGetSize((Frame *)(this->object).parent);
  iVar5 = uVar3 + (uint)bVar2 * 8;
  iVar6 = iVar5 + 0x10;
  if (0x303ff < version) {
    iVar6 = iVar5 + 0x2c;
    pLVar4 = (this->atomics).link.next;
    while (pLVar4 != &(this->atomics).link) {
      pLVar1 = pLVar4 + -3;
      pLVar4 = pLVar4->next;
      uVar3 = Geometry::streamGetSize((Geometry *)pLVar1->next);
      iVar6 = iVar6 + uVar3 + 0xc;
    }
  }
  pLVar4 = (this->atomics).link.next;
  while (pLVar4 != &(this->atomics).link) {
    pLVar1 = pLVar4->next;
    uVar3 = Atomic::streamGetSize((Atomic *)&pLVar4[-6].prev);
    iVar6 = iVar6 + uVar3 + 0xc;
    pLVar4 = pLVar1;
  }
  pLVar4 = (this->lights).link.next;
  while (pLVar4 != &(this->lights).link) {
    pLVar1 = pLVar4->next;
    uVar3 = Light::streamGetSize((Light *)&pLVar4[-6].prev);
    iVar6 = iVar6 + uVar3 + 0x1c;
    pLVar4 = pLVar1;
  }
  pLVar4 = (this->cameras).link.next;
  while (pLVar4 != &(this->cameras).link) {
    pLVar1 = pLVar4->next;
    uVar3 = Camera::streamGetSize((Camera *)&pLVar4[-0x23].prev);
    iVar6 = iVar6 + uVar3 + 0x1c;
    pLVar4 = pLVar1;
  }
  iVar5 = PluginList::streamGetSize((PluginList *)&s_plglist,this);
  return iVar5 + iVar6 + 0xc;
}

Assistant:

uint32
Clump::streamGetSize(void)
{
	uint32 size = 0;
	size += 12;	// Struct
	size += 4;	// numAtomics
	if(version > 0x33000)
		size += 8;	// numLights, numCameras

	// Frame list
	size += FrameList_::streamGetSize(this->getFrame());

	if(rw::version >= 0x30400){
		// Geometry list
		size += 12 + 12 + 4;
		FORLIST(lnk, this->atomics)
			size += 12 + Atomic::fromClump(lnk)->geometry->streamGetSize();
	}

	// Atomics
	FORLIST(lnk, this->atomics)
		size += 12 + Atomic::fromClump(lnk)->streamGetSize();

	// Lights
	FORLIST(lnk, this->lights)
		size += 16 + 12 + Light::fromClump(lnk)->streamGetSize();

	// Cameras
	FORLIST(lnk, this->cameras)
		size += 16 + 12 + Camera::fromClump(lnk)->streamGetSize();

	size += 12 + s_plglist.streamGetSize(this);
	return size;
}